

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_tre(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGv_i64 local_28;
  TCGv_i64 local_20;
  
  tcg_ctx = s->uc->tcg_ctx;
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_30 = (TCGTemp *)(o->out + (long)tcg_ctx);
  local_28 = o->out2 + (long)tcg_ctx;
  local_20 = o->in2 + (long)tcg_ctx;
  tcg_gen_callN_s390x(tcg_ctx,helper_tre,local_30,4,&local_38);
  tcg_gen_op3_s390x(tcg_ctx,INDEX_op_ld_i64,(TCGArg)(o->out2 + (long)tcg_ctx),
                    (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x308);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_tre(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_tre(tcg_ctx, o->out, tcg_ctx->cpu_env, o->out, o->out2, o->in2);
    return_low128(tcg_ctx, o->out2);
    set_cc_static(s);
    return DISAS_NEXT;
}